

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O1

VectorXd __thiscall
Tools::CalculateRMSE
          (Tools *this,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *estimations,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *ground_truth)

{
  pointer pMVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  Index size;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar5;
  invalid_argument *this_00;
  long *in_RCX;
  ulong uVar6;
  ulong uVar7;
  char *__function;
  long lVar8;
  DenseIndex extraout_RDX;
  DenseIndex extraout_RDX_00;
  DenseIndex DVar9;
  Matrix<double,__1,_1,_0,__1,_1> *other;
  pointer pMVar10;
  long *plVar11;
  _func_int *p_Var12;
  undefined1 auVar13 [16];
  VectorXd VVar14;
  VectorXd current_estimate;
  VectorXd cur_ground_truth;
  VectorXd residual;
  SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  tmp;
  scalar_sum_op<double> local_a1;
  DenseStorage<double,__1,__1,_1,_0> local_a0;
  DenseStorage<double,__1,__1,_1,_0> local_90;
  DenseStorage<double,__1,__1,_1,_0> local_80;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *local_70;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_68;
  Matrix<double,__1,_1,_0,__1,_1> *local_48;
  long *local_40;
  ulong local_38;
  
  local_70 = ground_truth;
  local_40 = in_RCX;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)this,4,4,1);
  local_68.m_row = 0;
  local_68.m_col = 1;
  local_68.m_currentBlockRows = 1;
  *this->_vptr_Tools = (_func_int *)0x0;
  local_a0.m_data = (double *)0x0;
  local_68.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)this;
  local_48 = (Matrix<double,__1,_1,_0,__1,_1> *)this;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_68,(Scalar *)&local_a0);
  local_90.m_data = (double *)0x0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar5,(Scalar *)&local_90);
  local_80.m_data = (double *)0x0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (pCVar5,(Scalar *)&local_80);
  if (((scalar_sum_op<double> *)(local_68.m_row + local_68.m_currentBlockRows) !=
       (scalar_sum_op<double> *)
       ((local_68.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
       m_rows) || (local_68.m_col != 1)) {
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/CommaInitializer.h"
                  ,0x6f,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  pMVar10 = (local_70->
            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pMVar1 = (local_70->
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pMVar10 == pMVar1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Error: Estimation vector size should not be zero");
  }
  else {
    if ((long)pMVar10 - (long)pMVar1 == local_40[1] - *local_40) {
      pMVar10 = (local_70->
                super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((local_70->
          super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          )._M_impl.super__Vector_impl_data._M_finish == pMVar10) {
        uVar6 = 0;
      }
      else {
        uVar7 = 0;
        do {
          DVar9 = pMVar10[uVar7].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
          local_38 = uVar7;
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_a0,DVar9,DVar9,1);
          pMVar10 = pMVar10 + uVar7;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_a0,
                     (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows,1);
          this = (Tools *)local_48;
          if (local_a0.m_rows !=
              (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows) {
LAB_001106c0:
            __function = 
            "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
            ;
LAB_0011070b:
            __assert_fail("rows() == other.rows() && cols() == other.cols()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/Assign.h"
                          ,0x1f9,__function);
          }
          uVar6 = local_a0.m_rows - (local_a0.m_rows >> 0x3f) & 0xfffffffffffffffe;
          if (1 < local_a0.m_rows) {
            lVar8 = 0;
            do {
              pdVar2 = (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data + lVar8;
              dVar3 = pdVar2[1];
              local_a0.m_data[lVar8] = *pdVar2;
              (local_a0.m_data + lVar8)[1] = dVar3;
              lVar8 = lVar8 + 2;
            } while (lVar8 < (long)uVar6);
          }
          if ((long)uVar6 < local_a0.m_rows) {
            pdVar2 = (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
            do {
              local_a0.m_data[uVar6] = pdVar2[uVar6];
              uVar6 = uVar6 + 1;
            } while (local_a0.m_rows != uVar6);
          }
          lVar8 = *local_40;
          DVar9 = *(DenseIndex *)(lVar8 + 8 + uVar7 * 0x10);
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_90,DVar9,DVar9,1);
          plVar11 = (long *)(lVar8 + uVar7 * 0x10);
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_90,
                     plVar11[1],1);
          if (local_90.m_rows != plVar11[1]) goto LAB_001106c0;
          uVar6 = local_90.m_rows - (local_90.m_rows >> 0x3f) & 0xfffffffffffffffe;
          if (1 < local_90.m_rows) {
            lVar8 = 0;
            do {
              pdVar2 = (double *)(*plVar11 + lVar8 * 8);
              dVar3 = pdVar2[1];
              local_90.m_data[lVar8] = *pdVar2;
              (local_90.m_data + lVar8)[1] = dVar3;
              lVar8 = lVar8 + 2;
            } while (lVar8 < (long)uVar6);
          }
          if ((long)uVar6 < local_90.m_rows) {
            lVar8 = *plVar11;
            do {
              local_90.m_data[uVar6] = *(double *)(lVar8 + uVar6 * 8);
              uVar6 = uVar6 + 1;
            } while (local_90.m_rows != uVar6);
          }
          if (local_a0.m_rows != local_90.m_rows) {
            __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/CwiseBinaryOp.h"
                          ,0x84,
                          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                         );
          }
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    (&local_80,local_90.m_rows,local_90.m_rows,1);
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_80,
                     local_90.m_rows,1);
          if (local_80.m_rows != local_90.m_rows) {
            __function = 
            "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>]"
            ;
            goto LAB_0011070b;
          }
          uVar6 = local_80.m_rows - (local_80.m_rows >> 0x3f) & 0xfffffffffffffffe;
          if (1 < local_80.m_rows) {
            lVar8 = 0;
            do {
              dVar3 = (local_a0.m_data + lVar8)[1];
              dVar4 = (local_90.m_data + lVar8)[1];
              local_80.m_data[lVar8] = local_a0.m_data[lVar8] - local_90.m_data[lVar8];
              (local_80.m_data + lVar8)[1] = dVar3 - dVar4;
              lVar8 = lVar8 + 2;
            } while (lVar8 < (long)uVar6);
          }
          if ((long)uVar6 < local_80.m_rows) {
            do {
              local_80.m_data[uVar6] = local_a0.m_data[uVar6] - local_90.m_data[uVar6];
              uVar6 = uVar6 + 1;
            } while (local_80.m_rows != uVar6);
          }
          if (0 < local_80.m_rows) {
            uVar6 = 0;
            do {
              local_80.m_data[uVar6] = local_80.m_data[uVar6] * local_80.m_data[uVar6];
              uVar6 = uVar6 + 1;
            } while (local_80.m_rows != uVar6);
          }
          local_68.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)this;
          local_68.m_row = (Index)&local_a1;
          Eigen::
          SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
          ::operator=((SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)&local_68,(Matrix<double,__1,_1,_0,__1,_1> *)&local_80);
          free(local_80.m_data);
          free(local_90.m_data);
          free(local_a0.m_data);
          uVar7 = local_38 + 1;
          pMVar10 = (local_70->
                    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar6 = (long)(local_70->
                        super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 4;
        } while (uVar7 < uVar6);
      }
      auVar13._8_4_ = (int)(uVar6 >> 0x20);
      auVar13._0_8_ = uVar6;
      auVar13._12_4_ = 0x45300000;
      local_68.m_col =
           (Index)((auVar13._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
      local_a0.m_rows = (DenseIndex)&local_68;
      local_68.m_xpr =
           (Matrix<double,__1,_1,_0,__1,_1> *)
           (((Matrix<double,__1,_1,_0,__1,_1> *)this)->
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      local_a0.m_data = (double *)this;
      if ((long)local_68.m_xpr < 0) {
        __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/CwiseNullaryOp.h"
                      ,0x3f,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      Eigen::
      SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::operator=((SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)&local_a0,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)&local_68);
      DVar9 = extraout_RDX;
      if (0 < (((Matrix<double,__1,_1,_0,__1,_1> *)this)->
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
        lVar8 = 0;
        do {
          p_Var12 = (_func_int *)
                    (((Matrix<double,__1,_1,_0,__1,_1> *)this)->
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
                    [lVar8];
          if ((double)p_Var12 < 0.0) {
            p_Var12 = (_func_int *)sqrt((double)p_Var12);
            DVar9 = extraout_RDX_00;
          }
          else {
            p_Var12 = (_func_int *)SQRT((double)p_Var12);
          }
          if ((((Matrix<double,__1,_1,_0,__1,_1> *)this)->
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
              lVar8) {
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x17a,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          (((Matrix<double,__1,_1,_0,__1,_1> *)this)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data[lVar8] =
               (double)p_Var12;
          lVar8 = lVar8 + 1;
        } while (lVar8 < (((Matrix<double,__1,_1,_0,__1,_1> *)this)->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                         m_rows);
      }
      VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = DVar9
      ;
      VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)this;
      return (VectorXd)
             VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Error: Estimation vector size should equal ground truth size");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

VectorXd Tools::CalculateRMSE(const vector<VectorXd> &estimations,
                              const vector<VectorXd> &ground_truth) {
    VectorXd rmse(4);
    rmse << 0,0,0,0;

    if(estimations.size() < 1) {
        throw std::invalid_argument( "Error: Estimation vector size should not be zero");
    }
    else if(estimations.size() != ground_truth.size()) {
        throw std::invalid_argument( "Error: Estimation vector size should equal ground truth size");
    } else {
        //accumulate squared residuals
        for(int i=0; i < estimations.size(); ++i){
            VectorXd current_estimate = estimations[i];
            VectorXd cur_ground_truth = ground_truth[i];
            VectorXd residual = current_estimate - cur_ground_truth;
            for(int j=0; j<residual.size(); ++j) {
                residual[j] = residual[j] * residual[j];
            }
            rmse += residual;
        }

        //calculate the mean
        rmse /= estimations.size();

        //calculate the squared root
        for(int i=0; i<rmse.size(); ++i) {
            rmse[i] = sqrt(rmse[i]);
        }

        //return the result
        return rmse;
    }
}